

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteInfixBinaryExpr
          (CWriter *this,Opcode opcode,char *op,AssignOp assign_op)

{
  size_t sVar1;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u;
  Opcode local_88;
  StackVar local_84;
  Info local_78;
  
  local_88.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_78,&local_88);
  local_78.name._0_4_ = 1;
  local_78._4_8_ = local_78.result_type;
  Write(this,(StackVar *)&local_78);
  if (assign_op == Allowed) {
    local_78.name._0_4_ = 0;
    local_78._4_8_ = 0;
    WriteData(this," ",1);
    sVar1 = strlen(op);
    WriteData(this,op,sVar1);
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::StackVar>
              ((CWriter *)this,(char (*) [3])0x171ff3,(StackVar *)&local_78);
    u = extraout_RDX;
  }
  else {
    local_78.name._0_4_ = 1;
    local_78._4_8_ = 0;
    local_84.index = 0;
    local_84.type.enum_ = Any;
    local_84.type.type_index_ = 0;
    WriteData(this," = ",3);
    Write(this,(StackVar *)&local_78);
    WriteData(this," ",1);
    sVar1 = strlen(op);
    WriteData(this,op,sVar1);
    WriteData(this," ",1);
    Write(this,&local_84);
    u = extraout_RDX_00;
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [2])0x171bb9,u);
  DropTypes(this,2);
  PushType(this,local_78.result_type);
  return;
}

Assistant:

void CWriter::WriteInfixBinaryExpr(Opcode opcode,
                                   const char* op,
                                   AssignOp assign_op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type));
  if (assign_op == AssignOp::Allowed) {
    Write(" ", op, "= ", StackVar(0));
  } else {
    Write(" = ", StackVar(1), " ", op, " ", StackVar(0));
  }
  Write(";", Newline());
  DropTypes(2);
  PushType(result_type);
}